

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncapsulatedFileManager.cpp
# Opt level: O0

int __thiscall
supermap::io::EncapsulatedFileManager::rename(EncapsulatedFileManager *this,char *__old,char *__new)

{
  int extraout_EAX;
  pointer pFVar1;
  path *in_stack_00000020;
  EncapsulatedFileManager *in_stack_00000028;
  undefined1 local_68 [40];
  undefined1 local_40 [40];
  char *local_18;
  char *local_10;
  EncapsulatedFileManager *local_8;
  
  local_18 = __new;
  local_10 = __old;
  local_8 = this;
  pFVar1 = std::
           unique_ptr<supermap::io::FileManager,_std::default_delete<supermap::io::FileManager>_>::
           operator->((unique_ptr<supermap::io::FileManager,_std::default_delete<supermap::io::FileManager>_>
                       *)0x11a13f);
  makeRootPath(in_stack_00000028,in_stack_00000020);
  makeRootPath(in_stack_00000028,in_stack_00000020);
  (*pFVar1->_vptr_FileManager[3])(pFVar1,local_40,local_68);
  std::filesystem::__cxx11::path::~path((path *)this);
  std::filesystem::__cxx11::path::~path((path *)this);
  return extraout_EAX;
}

Assistant:

void EncapsulatedFileManager::rename(const std::filesystem::path &prevPath, const std::filesystem::path &nextPath) {
    innerManager_->rename(makeRootPath(prevPath), makeRootPath(nextPath));
}